

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall IVmBifTadsRNG::put_state(IVmBifTadsRNG *this,vm_val_t *val)

{
  int32_t iVar1;
  int iVar2;
  ulong uVar3;
  CVmObject *pCVar4;
  unsigned_long uVar5;
  void *pvVar6;
  size_t *psVar7;
  long *plVar8;
  undefined8 *puVar9;
  int *in_RSI;
  long *in_RDI;
  err_frame_t err_cur__;
  char *buf;
  unsigned_long cnt;
  CVmObjByteArray *barr;
  size_t len;
  vm_val_t *in_stack_fffffffffffffed0;
  size_t len_00;
  uint local_110 [2];
  void *in_stack_ffffffffffffff00;
  uchar *in_stack_ffffffffffffff08;
  CVmObjByteArray *in_stack_ffffffffffffff10;
  
  uVar3 = (**(code **)(*in_RDI + 0x30))();
  if (uVar3 == 0) {
    iVar1 = vm_val_t::num_to_int(in_stack_fffffffffffffed0);
    (**(code **)(*in_RDI + 0x40))(in_RDI,iVar1);
  }
  else {
    if (*in_RSI == 5) {
      pCVar4 = vm_objp(0);
      iVar2 = (*pCVar4->_vptr_CVmObject[1])(pCVar4,CVmObjByteArray::metaclass_reg_);
      if (iVar2 != 0) {
        vm_objp(0);
      }
    }
    uVar5 = CVmObjByteArray::get_element_count((CVmObjByteArray *)0x2a72bb);
    if (uVar5 != uVar3) {
      err_throw(0);
    }
    pvVar6 = operator_new__(uVar3);
    psVar7 = (size_t *)_ZTW11G_err_frame();
    len_00 = *psVar7;
    plVar8 = (long *)_ZTW11G_err_frame();
    *plVar8 = (long)local_110;
    local_110[0] = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff08);
    if (local_110[0] == 0) {
      CVmObjByteArray::copy_to_buf
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (unsigned_long)in_stack_ffffffffffffff00,len_00);
      (**(code **)(*in_RDI + 0x50))(in_RDI,pvVar6);
    }
    if (((local_110[0] & 0x8000) == 0) &&
       (local_110[0] = local_110[0] | 0x8000, pvVar6 != (void *)0x0)) {
      operator_delete__(pvVar6);
    }
    psVar7 = (size_t *)_ZTW11G_err_frame();
    *psVar7 = len_00;
    if ((local_110[0] & 0x4001) != 0) {
      puVar9 = (undefined8 *)_ZTW11G_err_frame();
      pvVar6 = in_stack_ffffffffffffff00;
      if ((*(uint *)*puVar9 & 2) != 0) {
        plVar8 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar8 + 0x10));
        pvVar6 = in_stack_ffffffffffffff00;
      }
      in_stack_ffffffffffffff00 = pvVar6;
      plVar8 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar8 + 0x10) = pvVar6;
      err_rethrow();
    }
    if ((local_110[0] & 2) != 0) {
      free(in_stack_ffffffffffffff00);
    }
  }
  return;
}

Assistant:

void put_state(VMG_ vm_val_t *val)
    {
        /* determine what to do based on the state length */
        size_t len = get_state_size();
        if (len == 0)
        {
            /* simple int32_t state */
            put_state_int(val->num_to_int(vmg0_));
        }
        else
        {
            /* retrieve the ByteArray object */
            CVmObjByteArray *barr = vm_val_cast(CVmObjByteArray, val);

            /* check that it matches the expected state buffer size */
            unsigned long cnt = barr->get_element_count();
            if (cnt != len)
                err_throw(VMERR_BAD_VAL_BIF);

            /* retrieve the bytes and restore the state */
            char *buf = new char[len];
            err_try
            {
                /* retrieve the bytes */
                barr->copy_to_buf((unsigned char *)buf, 1, len);

                /* restore the state */
                put_state_buf(buf);
            }
            err_finally
            {
                delete [] buf;
            }